

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O2

TestRequiredForeign * __thiscall
proto2_unittest::TestNestedRequiredForeign::_internal_mutable_payload
          (TestNestedRequiredForeign *this)

{
  TestRequiredForeign *pTVar1;
  Arena *arena;
  
  pTVar1 = (this->field_0)._impl_.payload_;
  if (pTVar1 != (TestRequiredForeign *)0x0) {
    return pTVar1;
  }
  arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pTVar1 = (TestRequiredForeign *)
           google::protobuf::Arena::DefaultConstruct<proto2_unittest::TestRequiredForeign>(arena);
  (this->field_0)._impl_.payload_ = pTVar1;
  return pTVar1;
}

Assistant:

inline ::proto2_unittest::TestRequiredForeign* PROTOBUF_NONNULL TestNestedRequiredForeign::_internal_mutable_payload() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.payload_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::proto2_unittest::TestRequiredForeign>(GetArena());
    _impl_.payload_ = reinterpret_cast<::proto2_unittest::TestRequiredForeign*>(p);
  }
  return _impl_.payload_;
}